

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routines.c
# Opt level: O1

int routine_cmp(void *a,void *b)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  
  plVar1 = *a;
  plVar2 = *b;
  if (*plVar1 == *plVar2) {
    return 0;
  }
  iVar3 = -1;
  if (((*(byte *)(plVar2 + 3) & 1) <= (*(byte *)(plVar1 + 3) & 1)) &&
     (iVar3 = 1, (*(byte *)(plVar1 + 3) & 1) <= (*(byte *)(plVar2 + 3) & 1))) {
    iVar3 = strcmp((char *)plVar1[1],(char *)plVar2[1]);
    return iVar3;
  }
  return iVar3;
}

Assistant:

static int
routine_cmp(const void *a, const void *b)
{
	const struct routine *aa = *(const struct routine **)a;
	const struct routine *bb = *(const struct routine **)b;
	if (aa->f == bb->f)
		return 0;
	if (aa->multicore < bb->multicore)
		return -1;
	if (aa->multicore > bb->multicore)
		return 1;
	return strcmp(aa->name, bb->name);
}